

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  __pid_t _Var2;
  raw_ostream *prVar3;
  StringRef SVar4;
  uint in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff60;
  int local_6c;
  undefined1 local_65;
  int i_1;
  int iStack_60;
  char buf [1];
  pid_t original_pid;
  int p [2];
  int i;
  StringRef local_48;
  PrettyStackTraceProgram local_38 [8];
  PrettyStackTraceProgram X;
  char **argv_local;
  int argc_local;
  
  llvm::PrettyStackTraceProgram::PrettyStackTraceProgram(local_38,argc,argv);
  llvm::StringRef::StringRef(&local_48,"llvm codegen stress-tester\n");
  SVar4.Length = 0;
  SVar4.Data = (char *)local_48.Length;
  llvm::cl::ParseCommandLineOptions
            ((cl *)(ulong)(uint)argc,(int)argv,(char **)local_48.Data,SVar4,(raw_ostream *)0x0,
             (char *)((ulong)in_stack_ffffffffffffff5c << 0x20),(bool)in_stack_ffffffffffffff60);
  iVar1 = llvm::cl::opt_storage::operator_cast_to_int
                    ((opt_storage *)((anonymous_namespace)::W + 0x80));
  if (iVar1 < 2) {
    anon_unknown.dwarf_23886::die("Width must be >= 2");
  }
  (anonymous_namespace)::Shmem = (__atomic_base<long> *)mmap((void *)0x0,0x1498,3,0x21,-1,0);
  if ((anonymous_namespace)::Shmem == (__atomic_base<long> *)0xffffffffffffffff) {
    anon_unknown.dwarf_23886::die("mmap failed");
  }
  std::__atomic_base<long>::operator=((anonymous_namespace)::Shmem,1);
  *(undefined4 *)((long)&(anonymous_namespace)::Shmem[0x291]._M_i + 4) = 1;
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)((anonymous_namespace)::Shmem + 6));
  if (iVar1 != 0) {
    anon_unknown.dwarf_23886::die("pthread_mutexattr_init failed");
  }
  iVar1 = pthread_mutexattr_setpshared((pthread_mutexattr_t *)((anonymous_namespace)::Shmem + 6),1);
  if (iVar1 != 0) {
    anon_unknown.dwarf_23886::die("pthread_mutexattr_setpshared failed");
  }
  iVar1 = pthread_mutex_init((pthread_mutex_t *)((anonymous_namespace)::Shmem + 1),
                             (pthread_mutexattr_t *)((anonymous_namespace)::Shmem + 6));
  if (iVar1 != 0) {
    anon_unknown.dwarf_23886::die("pthread_mutex_init failed");
  }
  iVar1 = pthread_condattr_init((pthread_condattr_t *)((anonymous_namespace)::Shmem + 0x291));
  if (iVar1 != 0) {
    anon_unknown.dwarf_23886::die("pthread_condattr_init failed");
  }
  iVar1 = pthread_condattr_setpshared
                    ((pthread_condattr_t *)((anonymous_namespace)::Shmem + 0x291),1);
  if (iVar1 != 0) {
    anon_unknown.dwarf_23886::die("pthread_condattr_setpshared failed");
  }
  for (p[0] = 0; p[0] < 100; p[0] = p[0] + 1) {
    iVar1 = pthread_cond_init((pthread_cond_t *)((anonymous_namespace)::Shmem + (long)p[0] * 6 + 7),
                              (pthread_condattr_t *)((anonymous_namespace)::Shmem + 0x291));
    if (iVar1 != 0) {
      anon_unknown.dwarf_23886::die("pthread_cond_init failed");
    }
    *(undefined4 *)((long)&(anonymous_namespace)::Shmem[0x25f]._M_i + (long)p[0] * 4) = 0;
  }
  (anonymous_namespace)::Init = 1;
  i_1 = getpid();
  iVar1 = atexit(anon_unknown.dwarf_23886::decrease_runners);
  if (iVar1 != 0) {
    anon_unknown.dwarf_23886::die("atexit failed");
  }
  iVar1 = pipe(&stack0xffffffffffffffa0);
  if (iVar1 != 0) {
    anon_unknown.dwarf_23886::die("pipe failed??");
  }
  anon_unknown.dwarf_23886::generate();
  anon_unknown.dwarf_23886::output();
  _Var2 = getpid();
  if (_Var2 == i_1) {
    close(original_pid);
    read(iStack_60,&local_65,1);
    for (local_6c = 0; local_6c < 100; local_6c = local_6c + 1) {
      if (*(int *)((long)&(anonymous_namespace)::Shmem[0x25f]._M_i + (long)local_6c * 4) != 0) {
        prVar3 = (raw_ostream *)llvm::errs();
        prVar3 = llvm::raw_ostream::operator<<(prVar3,"oops, there are waiting processes at ");
        prVar3 = llvm::raw_ostream::operator<<(prVar3,local_6c);
        llvm::raw_ostream::operator<<(prVar3,"\n");
      }
    }
  }
  llvm::PrettyStackTraceProgram::~PrettyStackTraceProgram(local_38);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  PrettyStackTraceProgram X(argc, argv);
  cl::ParseCommandLineOptions(argc, argv, "llvm codegen stress-tester\n");

  if (W < 2)
    die("Width must be >= 2");

  Shmem =
      (struct shared *)::mmap(0, sizeof(struct shared), PROT_READ | PROT_WRITE,
                              MAP_SHARED | MAP_ANON, -1, 0);
  if (Shmem == MAP_FAILED)
    die("mmap failed");
  Shmem->NextId = 1;
  Shmem->Running = 1;
  if (pthread_mutexattr_init(&Shmem->LockAttr) != 0)
    die("pthread_mutexattr_init failed");
  if (pthread_mutexattr_setpshared(&Shmem->LockAttr, PTHREAD_PROCESS_SHARED) !=
      0)
    die("pthread_mutexattr_setpshared failed");
  if (pthread_mutex_init(&Shmem->Lock, &Shmem->LockAttr) != 0)
    die("pthread_mutex_init failed");
  if (pthread_condattr_init(&Shmem->CondAttr) != 0)
    die("pthread_condattr_init failed");
  if (pthread_condattr_setpshared(&Shmem->CondAttr, PTHREAD_PROCESS_SHARED) !=
      0)
    die("pthread_condattr_setpshared failed");
  for (int i = 0; i < MAX_DEPTH; ++i) {
    if (pthread_cond_init(&Shmem->Cond[i], &Shmem->CondAttr) != 0)
      die("pthread_cond_init failed");
    Shmem->Waiting[i] = 0;
  }
  Init = 1;

  int p[2];
  pid_t original_pid = ::getpid();
  if (::atexit(decrease_runners) != 0)
    die("atexit failed");
  /*
   * use a trick from stackoverflow to work around the fact that in
   * UNIX we can only wait on our children, not our extended
   * descendents: all descendents are going to inherit this pipe,
   * implicitly closing its fds when they terminate. at that point
   * reading from the pipe will not block but rather return with EOF
   */
  if (::pipe(p) != 0)
    die("pipe failed??");

  generate();
  output();

  if (::getpid() == original_pid) {
    char buf[1];
    ::close(p[1]);
    ::read(p[0], buf, 1);
    for (int i = 0; i < MAX_DEPTH; i++) {
      if (Shmem->Waiting[i] != 0)
        errs() << "oops, there are waiting processes at " << i << "\n";
    }
  }

  return 0;
}